

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O0

void loop_op(vm *v,instruction *inst)

{
  func_type bt_00;
  undefined1 local_40 [8];
  func_type bt;
  blockArgs *ba;
  instruction *inst_local;
  vm *v_local;
  
  bt.return_types = (byte *)inst->arg;
  get_block_type((func_type *)local_40,v,*(int32 *)bt.return_types);
  bt_00.param_types = (byte *)bt._0_8_;
  bt_00._0_8_ = local_40;
  bt_00._16_8_ = bt.param_types;
  bt_00.return_types = (byte *)bt._16_8_;
  enterBlock(v,'\x03',bt_00,(vec *)(bt.return_types + 8));
  return;
}

Assistant:

void loop_op(vm *v, instruction *inst) {
    blockArgs *ba = (blockArgs *) inst->arg;
    func_type bt = get_block_type(v, ba->blockType);
    enterBlock(v, Loop, bt, &ba->instructions);
}